

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.h
# Opt level: O0

void __thiscall Logger::queueError<long>(Logger *this,ErrorType type,char *text,long *args)

{
  ErrorType type_00;
  size_t extraout_RDX;
  undefined4 in_register_00000034;
  string_view text_00;
  undefined1 local_40 [8];
  string message;
  long *args_local;
  char *text_local;
  ErrorType type_local;
  
  message.field_2._8_8_ = text;
  tinyformat::format<long>
            ((string *)local_40,(char *)CONCAT44(in_register_00000034,type),(long *)text);
  type_00 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_40);
  text_00._M_str = (char *)args;
  text_00._M_len = extraout_RDX;
  queueError((Logger *)((ulong)this & 0xffffffff),type_00,text_00);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

static void queueError(ErrorType type, const char* text, const Args&... args)
	{
		std::string message = tfm::format(text,args...);
		queueError(type,message);
	}